

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRadiusDimension,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcDimensionCurveDirectedCallout *this;
  
  this = (IfcDimensionCurveDirectedCallout *)operator_new(0x80);
  *(undefined ***)&this->field_0x68 = &PTR__Object_00816a50;
  this[1].super_IfcDraughtingCallout.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x0;
  *(char **)&this[1].super_IfcDraughtingCallout.super_IfcGeometricRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x8 =
       "IfcRadiusDimension";
  Assimp::IFC::Schema_2x3::IfcDimensionCurveDirectedCallout::IfcDimensionCurveDirectedCallout
            (this,&PTR_construction_vtable_24__0083f650);
  (this->super_IfcDraughtingCallout).super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x83f570;
  *(undefined8 *)&this->field_0x68 = 0x83f638;
  *(undefined8 *)
   &(this->super_IfcDraughtingCallout).super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x83f598;
  *(undefined8 *)
   &(this->super_IfcDraughtingCallout).super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x83f5c0;
  *(undefined8 *)&(this->super_IfcDraughtingCallout).field_0x48 = 0x83f5e8;
  *(undefined8 *)&(this->super_IfcDraughtingCallout).field_0x58 = 0x83f610;
  return (Object *)&this->field_0x68;
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }